

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

FT_Bool Normalize(FT_F26Dot6 Vx,FT_F26Dot6 Vy,FT_UnitVector *R)

{
  ulong uVar1;
  FT_Vector V;
  
  uVar1 = Vy | Vx;
  if (uVar1 != 0) {
    V.x = Vx;
    V.y = Vy;
    FT_Vector_NormLen(&V);
    R->x = (FT_F2Dot14)(V.x / 4);
    uVar1 = V.y / 4;
    R->y = (FT_F2Dot14)uVar1;
  }
  return (FT_Bool)uVar1;
}

Assistant:

static FT_Bool
  Normalize( FT_F26Dot6      Vx,
             FT_F26Dot6      Vy,
             FT_UnitVector*  R )
  {
    FT_Vector V;


    if ( Vx == 0 && Vy == 0 )
    {
      /* XXX: UNDOCUMENTED! It seems that it is possible to try   */
      /*      to normalize the vector (0,0).  Return immediately. */
      return SUCCESS;
    }

    V.x = Vx;
    V.y = Vy;

    FT_Vector_NormLen( &V );

    R->x = (FT_F2Dot14)( V.x / 4 );
    R->y = (FT_F2Dot14)( V.y / 4 );

    return SUCCESS;
  }